

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

int mtree_entry_new(archive_write *a,archive_entry *entry,mtree_entry_conflict **m_entry)

{
  uint uVar1;
  mode_t mVar2;
  void *pvVar3;
  char *pcVar4;
  int64_t iVar5;
  archive_string *__s;
  time_t tVar6;
  long lVar7;
  dev_t dVar8;
  void *pvVar9;
  undefined8 *in_RDX;
  archive_entry *in_RSI;
  archive *in_RDI;
  archive_entry *in_stack_00000008;
  mtree_entry_conflict *in_stack_00000010;
  archive_write *in_stack_00000018;
  int r;
  char *s;
  mtree_entry_conflict *me;
  archive_entry *in_stack_ffffffffffffff68;
  archive_entry *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffff88;
  archive_string *in_stack_ffffffffffffff90;
  int local_4;
  
  pvVar3 = calloc(1,0x150);
  if (pvVar3 == (void *)0x0) {
    archive_set_error(in_RDI,0xc,"Can\'t allocate memory for a mtree entry");
    *in_RDX = 0;
    local_4 = -0x1e;
  }
  else {
    local_4 = mtree_entry_setup_filenames(in_stack_00000018,in_stack_00000010,in_stack_00000008);
    if (local_4 < -0x14) {
      mtree_entry_free((mtree_entry_conflict *)0x2ad40e);
      *in_RDX = 0;
    }
    else {
      pcVar4 = archive_entry_symlink(in_stack_ffffffffffffff68);
      if (pcVar4 != (char *)0x0) {
        *(undefined8 *)((long)pvVar3 + 0x88) = 0;
        if (pcVar4 != (char *)0x0) {
          strlen(pcVar4);
        }
        archive_strncat(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                        in_stack_ffffffffffffff80);
      }
      uVar1 = archive_entry_nlink(in_RSI);
      *(uint *)((long)pvVar3 + 0xe0) = uVar1;
      mVar2 = archive_entry_filetype(in_RSI);
      *(mode_t *)((long)pvVar3 + 0xe4) = mVar2;
      mVar2 = archive_entry_mode(in_RSI);
      *(mode_t *)((long)pvVar3 + 0xe8) = mVar2 & 0xfff;
      iVar5 = archive_entry_uid(in_RSI);
      *(int64_t *)((long)pvVar3 + 0xf8) = iVar5;
      iVar5 = archive_entry_gid(in_RSI);
      *(int64_t *)((long)pvVar3 + 0x100) = iVar5;
      pcVar4 = archive_entry_uname(in_stack_ffffffffffffff68);
      if (pcVar4 != (char *)0x0) {
        *(undefined8 *)((long)pvVar3 + 0xa0) = 0;
        if (pcVar4 != (char *)0x0) {
          strlen(pcVar4);
        }
        archive_strncat(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                        in_stack_ffffffffffffff80);
      }
      __s = (archive_string *)archive_entry_gname(in_stack_ffffffffffffff68);
      if (__s != (archive_string *)0x0) {
        *(undefined8 *)((long)pvVar3 + 0xb8) = 0;
        in_stack_ffffffffffffff88 = (void *)((long)pvVar3 + 0xb0);
        if (__s == (archive_string *)0x0) {
          in_stack_ffffffffffffff80 = 0;
          in_stack_ffffffffffffff90 = __s;
        }
        else {
          in_stack_ffffffffffffff80 = strlen((char *)__s);
          in_stack_ffffffffffffff90 = __s;
        }
        archive_strncat(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                        in_stack_ffffffffffffff80);
      }
      pcVar4 = archive_entry_fflags_text(in_stack_ffffffffffffff78);
      if (pcVar4 != (char *)0x0) {
        *(undefined8 *)((long)pvVar3 + 0xd0) = 0;
        if (pcVar4 == (char *)0x0) {
          in_stack_ffffffffffffff68 = (archive_entry *)0x0;
        }
        else {
          in_stack_ffffffffffffff68 = (archive_entry *)strlen(pcVar4);
        }
        archive_strncat(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                        in_stack_ffffffffffffff80);
      }
      archive_entry_fflags
                (in_RSI,(unsigned_long *)((long)pvVar3 + 0x118),
                 (unsigned_long *)((long)pvVar3 + 0x120));
      tVar6 = archive_entry_mtime(in_RSI);
      *(time_t *)((long)pvVar3 + 0x108) = tVar6;
      lVar7 = archive_entry_mtime_nsec(in_RSI);
      *(long *)((long)pvVar3 + 0x110) = lVar7;
      dVar8 = archive_entry_rdevmajor(in_stack_ffffffffffffff68);
      *(dev_t *)((long)pvVar3 + 0x128) = dVar8;
      dVar8 = archive_entry_rdevminor(in_stack_ffffffffffffff68);
      *(dev_t *)((long)pvVar3 + 0x130) = dVar8;
      dVar8 = archive_entry_devmajor(in_stack_ffffffffffffff68);
      *(dev_t *)((long)pvVar3 + 0x138) = dVar8;
      dVar8 = archive_entry_devminor(in_stack_ffffffffffffff68);
      *(dev_t *)((long)pvVar3 + 0x140) = dVar8;
      iVar5 = archive_entry_ino(in_RSI);
      *(int64_t *)((long)pvVar3 + 0x148) = iVar5;
      iVar5 = archive_entry_size(in_RSI);
      *(int64_t *)((long)pvVar3 + 0xf0) = iVar5;
      if (*(int *)((long)pvVar3 + 0xe4) == 0x4000) {
        pvVar9 = calloc(1,0x30);
        *(void **)((long)pvVar3 + 0x28) = pvVar9;
        if (*(long *)((long)pvVar3 + 0x28) == 0) {
          mtree_entry_free((mtree_entry_conflict *)0x2ad7d6);
          archive_set_error(in_RDI,0xc,"Can\'t allocate memory for a mtree entry");
          *in_RDX = 0;
          return -0x1e;
        }
        __archive_rb_tree_init(*(archive_rb_tree **)((long)pvVar3 + 0x28),&mtree_entry_new::rb_ops);
        *(undefined8 *)(*(long *)((long)pvVar3 + 0x28) + 0x10) = 0;
        *(long *)(*(long *)((long)pvVar3 + 0x28) + 0x18) = *(long *)((long)pvVar3 + 0x28) + 0x10;
        *(undefined8 *)(*(long *)((long)pvVar3 + 0x28) + 0x20) = 0;
      }
      else if (*(int *)((long)pvVar3 + 0xe4) == 0x8000) {
        pvVar9 = calloc(1,8);
        *(void **)((long)pvVar3 + 0x30) = pvVar9;
        if (*(long *)((long)pvVar3 + 0x30) == 0) {
          mtree_entry_free((mtree_entry_conflict *)0x2ad8a5);
          archive_set_error(in_RDI,0xc,"Can\'t allocate memory for a mtree entry");
          *in_RDX = 0;
          return -0x1e;
        }
        **(undefined4 **)((long)pvVar3 + 0x30) = 0;
      }
      *in_RDX = pvVar3;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int
mtree_entry_new(struct archive_write *a, struct archive_entry *entry,
    struct mtree_entry **m_entry)
{
	struct mtree_entry *me;
	const char *s;
	int r;
	static const struct archive_rb_tree_ops rb_ops = {
		mtree_entry_cmp_node, mtree_entry_cmp_key
	};

	me = calloc(1, sizeof(*me));
	if (me == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory for a mtree entry");
		*m_entry = NULL;
		return (ARCHIVE_FATAL);
	}

	r = mtree_entry_setup_filenames(a, me, entry);
	if (r < ARCHIVE_WARN) {
		mtree_entry_free(me);
		*m_entry = NULL;
		return (r);
	}

	if ((s = archive_entry_symlink(entry)) != NULL)
		archive_strcpy(&me->symlink, s);
	me->nlink = archive_entry_nlink(entry);
	me->filetype = archive_entry_filetype(entry);
	me->mode = archive_entry_mode(entry) & 07777;
	me->uid = archive_entry_uid(entry);
	me->gid = archive_entry_gid(entry);
	if ((s = archive_entry_uname(entry)) != NULL)
		archive_strcpy(&me->uname, s);
	if ((s = archive_entry_gname(entry)) != NULL)
		archive_strcpy(&me->gname, s);
	if ((s = archive_entry_fflags_text(entry)) != NULL)
		archive_strcpy(&me->fflags_text, s);
	archive_entry_fflags(entry, &me->fflags_set, &me->fflags_clear);
	me->mtime = archive_entry_mtime(entry);
	me->mtime_nsec = archive_entry_mtime_nsec(entry);
	me->rdevmajor = archive_entry_rdevmajor(entry);
	me->rdevminor = archive_entry_rdevminor(entry);
	me->devmajor = archive_entry_devmajor(entry);
	me->devminor = archive_entry_devminor(entry);
	me->ino = archive_entry_ino(entry);
	me->size = archive_entry_size(entry);
	if (me->filetype == AE_IFDIR) {
		me->dir_info = calloc(1, sizeof(*me->dir_info));
		if (me->dir_info == NULL) {
			mtree_entry_free(me);
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for a mtree entry");
			*m_entry = NULL;
			return (ARCHIVE_FATAL);
		}
		__archive_rb_tree_init(&me->dir_info->rbtree, &rb_ops);
		me->dir_info->children.first = NULL;
		me->dir_info->children.last = &(me->dir_info->children.first);
		me->dir_info->chnext = NULL;
	} else if (me->filetype == AE_IFREG) {
		me->reg_info = calloc(1, sizeof(*me->reg_info));
		if (me->reg_info == NULL) {
			mtree_entry_free(me);
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for a mtree entry");
			*m_entry = NULL;
			return (ARCHIVE_FATAL);
		}
		me->reg_info->compute_sum = 0;
	}

	*m_entry = me;
	return (ARCHIVE_OK);
}